

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLinLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImPlotRange *pIVar1;
  ImVec2 IVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXsYs<unsigned_short> *pGVar8;
  TransformerLinLog *pTVar9;
  GetterXsYRef<unsigned_short> *pGVar10;
  ImPlotPlot *pIVar11;
  ImDrawVert *pIVar12;
  ImDrawIdx *pIVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [12];
  ImPlotContext *pIVar18;
  ImPlotContext *pIVar19;
  int iVar20;
  long lVar21;
  ImDrawIdx IVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  pIVar18 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar20 = pGVar8->Count;
  lVar21 = (long)(((pGVar8->Offset + prim) % iVar20 + iVar20) % iVar20) * (long)pGVar8->Stride;
  uVar3 = *(ushort *)((long)pGVar8->Xs + lVar21);
  dVar14 = log10((double)*(ushort *)((long)pGVar8->Ys + lVar21) /
                 GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  pIVar19 = GImPlot;
  iVar20 = pTVar9->YAxis;
  pIVar1 = &pIVar18->CurrentPlot->YAxis[iVar20].Range;
  dVar15 = pIVar1->Min;
  pGVar10 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar5 = pGVar10->Count;
  uVar4 = *(ushort *)
           ((long)pGVar10->Xs +
           (long)(((prim + pGVar10->Offset) % iVar5 + iVar5) % iVar5) * (long)pGVar10->Stride);
  IVar2 = pIVar18->PixelRange[iVar20].Min;
  fVar25 = (float)(pIVar18->My[iVar20] *
                   (((double)(float)(dVar14 / pIVar18->LogDenY[iVar20]) * (pIVar1->Max - dVar15) +
                    dVar15) - dVar15) + (double)IVar2.y);
  fVar26 = (float)(pIVar18->Mx * ((double)uVar3 - (pIVar18->CurrentPlot->XAxis).Range.Min) +
                  (double)IVar2.x);
  dVar15 = log10(pGVar10->YRef / GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  iVar20 = pTVar9->YAxis;
  pIVar11 = pIVar19->CurrentPlot;
  dVar14 = pIVar11->YAxis[iVar20].Range.Min;
  IVar2 = pIVar19->PixelRange[iVar20].Min;
  fVar23 = (float)(pIVar19->Mx * ((double)uVar4 - (pIVar11->XAxis).Range.Min) + (double)IVar2.x);
  fVar24 = (float)(pIVar19->My[iVar20] *
                   (((double)(float)(dVar15 / pIVar19->LogDenY[iVar20]) *
                     (pIVar11->YAxis[iVar20].Range.Max - dVar14) + dVar14) - dVar14) +
                  (double)IVar2.y);
  auVar30._0_4_ = ~-(uint)(fVar23 <= fVar26) & (uint)fVar23;
  auVar30._4_4_ = ~-(uint)(fVar24 <= fVar25) & (uint)fVar24;
  auVar30._8_4_ = ~-(uint)(fVar26 < fVar23) & (uint)fVar23;
  auVar30._12_4_ = ~-(uint)(fVar25 < fVar24) & (uint)fVar24;
  auVar16._4_4_ = (uint)fVar25 & -(uint)(fVar24 <= fVar25);
  auVar16._0_4_ = (uint)fVar26 & -(uint)(fVar23 <= fVar26);
  auVar16._8_4_ = (uint)fVar26 & -(uint)(fVar26 < fVar23);
  auVar16._12_4_ = (uint)fVar25 & -(uint)(fVar25 < fVar24);
  auVar30 = auVar30 | auVar16;
  fVar27 = (cull_rect->Min).y;
  auVar32._4_4_ = -(uint)(fVar27 < auVar30._4_4_);
  auVar32._0_4_ = -(uint)((cull_rect->Min).x < auVar30._0_4_);
  auVar17._4_8_ = auVar30._8_8_;
  auVar17._0_4_ = -(uint)(auVar30._4_4_ < fVar27);
  auVar31._0_8_ = auVar17._0_8_ << 0x20;
  auVar31._8_4_ = -(uint)(auVar30._8_4_ < (cull_rect->Max).x);
  auVar31._12_4_ = -(uint)(auVar30._12_4_ < (cull_rect->Max).y);
  auVar32._8_8_ = auVar31._8_8_;
  iVar20 = movmskps((int)cull_rect,auVar32);
  if (iVar20 == 0xf) {
    IVar6 = this->Col;
    IVar2 = *uv;
    fVar27 = fVar23 - fVar26;
    fVar28 = fVar24 - fVar25;
    fVar29 = fVar27 * fVar27 + fVar28 * fVar28;
    if (0.0 < fVar29) {
      fVar29 = 1.0 / SQRT(fVar29);
      fVar27 = fVar27 * fVar29;
      fVar28 = fVar28 * fVar29;
    }
    fVar29 = this->Weight * 0.5;
    pIVar12 = DrawList->_VtxWritePtr;
    fVar27 = fVar29 * fVar27;
    fVar29 = fVar29 * fVar28;
    (pIVar12->pos).x = fVar29 + fVar26;
    (pIVar12->pos).y = fVar25 - fVar27;
    (pIVar12->uv).x = IVar2.x;
    (pIVar12->uv).y = IVar2.y;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar6;
    pIVar12[1].pos.x = fVar29 + fVar23;
    pIVar12[1].pos.y = fVar24 - fVar27;
    pIVar12[1].uv = IVar2;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar6;
    pIVar12[2].pos.x = fVar23 - fVar29;
    pIVar12[2].pos.y = fVar24 + fVar27;
    pIVar12[2].uv = IVar2;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar6;
    pIVar12[3].pos.x = fVar26 - fVar29;
    pIVar12[3].pos.y = fVar27 + fVar25;
    pIVar12[3].uv = IVar2;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar13 = DrawList->_IdxWritePtr;
    IVar22 = (ImDrawIdx)uVar7;
    *pIVar13 = IVar22;
    pIVar13[1] = IVar22 + 1;
    pIVar13[2] = IVar22 + 2;
    pIVar13[3] = IVar22;
    pIVar13[4] = IVar22 + 2;
    pIVar13[5] = IVar22 + 3;
    DrawList->_IdxWritePtr = pIVar13 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  return (char)iVar20 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }